

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

bool Imath_3_2::extractAndRemoveScalingAndShear<float>
               (Matrix44<float> *mat,Vec3<float> *scl,Vec3<float> *shr,bool exc)

{
  bool bVar1;
  float *pfVar2;
  byte in_CL;
  Vec3<float> *in_RDX;
  Vec3<float> *in_RSI;
  Matrix44<float> *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int i_3;
  int i_2;
  int i_1;
  int j;
  int i;
  float maxVal;
  Vec3<float> row [3];
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float fVar7;
  undefined4 in_stack_ffffffffffffff0c;
  undefined1 uVar8;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Vec3<float> *local_c0;
  int local_b4;
  int local_b0;
  Vec3<float> local_ac;
  Vec3<float> local_a0;
  Vec3<float> local_94;
  Vec3<float> local_88;
  int local_7c;
  int local_78;
  int local_74;
  float local_70;
  Vec3<float> local_6c;
  Vec3<float> local_60;
  Vec3<float> local_54;
  Vec3<float> local_48 [3];
  byte local_21;
  Vec3<float> *local_20;
  Vec3<float> *local_18;
  Matrix44<float> *local_10;
  bool local_1;
  
  local_21 = in_CL & 1;
  local_c0 = local_48;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    Vec3<float>::Vec3(local_c0);
    local_c0 = local_c0 + 1;
  } while (local_c0 != (Vec3<float> *)&stack0xffffffffffffffdc);
  pfVar2 = Matrix44<float>::operator[](local_10,0);
  fVar6 = *pfVar2;
  pfVar2 = Matrix44<float>::operator[](local_10,0);
  fVar7 = pfVar2[1];
  pfVar2 = Matrix44<float>::operator[](local_10,0);
  Vec3<float>::Vec3(&local_54,fVar6,fVar7,pfVar2[2]);
  Vec3<float>::operator=(local_48,&local_54);
  pfVar2 = Matrix44<float>::operator[](local_10,1);
  fVar3 = *pfVar2;
  pfVar2 = Matrix44<float>::operator[](local_10,1);
  fVar4 = pfVar2[1];
  pfVar2 = Matrix44<float>::operator[](local_10,1);
  Vec3<float>::Vec3(&local_60,fVar3,fVar4,pfVar2[2]);
  Vec3<float>::operator=(local_48 + 1,&local_60);
  pfVar2 = Matrix44<float>::operator[](local_10,2);
  fVar3 = *pfVar2;
  pfVar2 = Matrix44<float>::operator[](local_10,2);
  fVar4 = pfVar2[1];
  pfVar2 = Matrix44<float>::operator[](local_10,2);
  Vec3<float>::Vec3(&local_6c,fVar3,fVar4,pfVar2[2]);
  Vec3<float>::operator=(local_48 + 2,&local_6c);
  local_70 = 0.0;
  for (local_74 = 0; uVar8 = (undefined1)((uint)in_stack_ffffffffffffff0c >> 0x18), local_74 < 3;
      local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
      pfVar2 = Vec3<float>::operator[](local_48 + local_74,local_78);
      fVar3 = abs<float>(*pfVar2);
      if (local_70 < fVar3) {
        pfVar2 = Vec3<float>::operator[](local_48 + local_74,local_78);
        local_70 = abs<float>(*pfVar2);
      }
    }
  }
  if ((local_70 != 0.0) || (NAN(local_70))) {
    for (local_7c = 0; uVar8 = (undefined1)((uint)in_stack_ffffffffffffff0c >> 0x18), local_7c < 3;
        local_7c = local_7c + 1) {
      bVar1 = checkForZeroScaleInRow<float>
                        ((float *)CONCAT44(fVar7,fVar6),
                         (Vec3<float> *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(bool)uVar8);
      if (!bVar1) {
        return false;
      }
      Vec3<float>::operator/=(local_48 + local_7c,local_70);
    }
  }
  fVar3 = Vec3<float>::length((Vec3<float> *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_18->x = fVar3;
  bVar1 = checkForZeroScaleInRow<float>
                    ((float *)CONCAT44(fVar7,fVar6),
                     (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (bool)uVar8);
  if (bVar1) {
    Vec3<float>::operator/=(local_48,local_18->x);
    fVar3 = Vec3<float>::dot(local_48,local_48 + 1);
    pfVar2 = Vec3<float>::operator[](local_20,0);
    *pfVar2 = fVar3;
    Vec3<float>::operator[](local_20,0);
    operator*(in_stack_fffffffffffffefc,
              (Vec3<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    Vec3<float>::operator-=(local_48 + 1,&local_88);
    fVar4 = Vec3<float>::length((Vec3<float> *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_18->y = fVar4;
    bVar1 = checkForZeroScaleInRow<float>
                      ((float *)CONCAT44(fVar7,fVar6),
                       (Vec3<float> *)CONCAT44(fVar3,in_stack_ffffffffffffff10),(bool)uVar8);
    if (bVar1) {
      Vec3<float>::operator/=(local_48 + 1,local_18->y);
      fVar4 = local_18->y;
      pfVar2 = Vec3<float>::operator[](local_20,0);
      *pfVar2 = *pfVar2 / fVar4;
      fVar4 = Vec3<float>::dot(local_48,local_48 + 2);
      pfVar2 = Vec3<float>::operator[](local_20,1);
      *pfVar2 = fVar4;
      Vec3<float>::operator[](local_20,1);
      uVar8 = (undefined1)((uint)fVar4 >> 0x18);
      operator*(in_stack_fffffffffffffefc,
                (Vec3<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      Vec3<float>::operator-=(local_48 + 2,&local_94);
      fVar4 = Vec3<float>::dot(local_48 + 1,local_48 + 2);
      pfVar2 = Vec3<float>::operator[](local_20,2);
      *pfVar2 = fVar4;
      Vec3<float>::operator[](local_20,2);
      operator*(in_stack_fffffffffffffefc,
                (Vec3<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      Vec3<float>::operator-=(local_48 + 2,&local_a0);
      fVar5 = Vec3<float>::length((Vec3<float> *)
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      local_18->z = fVar5;
      bVar1 = checkForZeroScaleInRow<float>
                        ((float *)CONCAT44(fVar7,fVar6),(Vec3<float> *)CONCAT44(fVar3,fVar4),
                         (bool)uVar8);
      if (bVar1) {
        Vec3<float>::operator/=(local_48 + 2,local_18->z);
        fVar6 = local_18->z;
        pfVar2 = Vec3<float>::operator[](local_20,1);
        *pfVar2 = *pfVar2 / fVar6;
        fVar7 = local_18->z;
        pfVar2 = Vec3<float>::operator[](local_20,2);
        *pfVar2 = *pfVar2 / fVar7;
        Vec3<float>::cross((Vec3<float> *)CONCAT44(fVar7,fVar6),
                           (Vec3<float> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        fVar6 = Vec3<float>::dot(local_48,&local_ac);
        if (fVar6 < 0.0) {
          for (local_b0 = 0; local_b0 < 3; local_b0 = local_b0 + 1) {
            pfVar2 = Vec3<float>::operator[](local_18,local_b0);
            *pfVar2 = *pfVar2 * -1.0;
            Vec3<float>::operator*=(local_48 + local_b0,-1.0);
          }
        }
        for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
          pfVar2 = Vec3<float>::operator[](local_48 + local_b4,0);
          fVar6 = *pfVar2;
          pfVar2 = Matrix44<float>::operator[](local_10,local_b4);
          *pfVar2 = fVar6;
          pfVar2 = Vec3<float>::operator[](local_48 + local_b4,1);
          fVar6 = *pfVar2;
          pfVar2 = Matrix44<float>::operator[](local_10,local_b4);
          pfVar2[1] = fVar6;
          pfVar2 = Vec3<float>::operator[](local_48 + local_b4,2);
          fVar6 = *pfVar2;
          pfVar2 = Matrix44<float>::operator[](local_10,local_b4);
          pfVar2[2] = fVar6;
        }
        Vec3<float>::operator*=(local_18,local_70);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
extractAndRemoveScalingAndShear (
    Matrix44<T>& mat, Vec3<T>& scl, Vec3<T>& shr, bool exc)
{
    //
    // This implementation follows the technique described in the paper by
    // Spencer W. Thomas in the Graphics Gems II article: "Decomposing a
    // Matrix into Simple Transformations", p. 320.
    //

    Vec3<T> row[3];

    row[0] = Vec3<T> (mat[0][0], mat[0][1], mat[0][2]);
    row[1] = Vec3<T> (mat[1][0], mat[1][1], mat[1][2]);
    row[2] = Vec3<T> (mat[2][0], mat[2][1], mat[2][2]);

    T maxVal = 0;
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            if (IMATH_INTERNAL_NAMESPACE::abs (row[i][j]) > maxVal)
                maxVal = IMATH_INTERNAL_NAMESPACE::abs (row[i][j]);

    //
    // We normalize the 3x3 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 3x3 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the
    // scaling factors by maxVal at the end (shear and rotation are not
    // affected by the normalization).

    if (maxVal != 0)
    {
        for (int i = 0; i < 3; i++)
            if (!checkForZeroScaleInRow (maxVal, row[i], exc))
                return false;
            else
                row[i] /= maxVal;
    }

    // Compute X scale factor.
    scl.x = row[0].length ();
    if (!checkForZeroScaleInRow (scl.x, row[0], exc)) return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 6 combinations (XY, XZ, YZ, YX, ZX, ZY), although we only
    // extract the first 3 because we can effect the last 3 by shearing in
    // XY, XZ, YZ combined rotations and scales.
    //
    // shear matrix <   1,  YX,  ZX,  0,
    //                 XY,   1,  ZY,  0,
    //                 XZ,  YZ,   1,  0,
    //                  0,   0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr[0] = row[0].dot (row[1]);
    row[1] -= shr[0] * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (!checkForZeroScaleInRow (scl.y, row[1], exc)) return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y;
    shr[0] /= scl.y;

    // Compute XZ and YZ shears, orthogonalize 3rd row.
    shr[1] = row[0].dot (row[2]);
    row[2] -= shr[1] * row[0];
    shr[2] = row[1].dot (row[2]);
    row[2] -= shr[2] * row[1];

    // Next, get Z scale.
    scl.z = row[2].length ();
    if (!checkForZeroScaleInRow (scl.z, row[2], exc)) return false;

    // Normalize 3rd row and correct the XZ and YZ shear factors for Z scaling.
    row[2] /= scl.z;
    shr[1] /= scl.z;
    shr[2] /= scl.z;

    // At this point, the upper 3x3 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is less than zero, then negate the matrix and the scaling factors.
    if (row[0].dot (row[1].cross (row[2])) < 0)
        for (int i = 0; i < 3; i++)
        {
            scl[i] *= -1;
            row[i] *= -1;
        }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 3x3 matrix in mat is now a rotation matrix.
    for (int i = 0; i < 3; i++)
    {
        mat[i][0] = row[i][0];
        mat[i][1] = row[i][1];
        mat[i][2] = row[i][2];
    }

    // Correct the scaling factors for the normalization step that we
    // performed above; shear and rotation are not affected by the
    // normalization.
    scl *= maxVal;

    return true;
}